

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speed_features.c
# Opt level: O0

void set_speed_features_lc_dec_qindex_dependent(AV1_COMP *cpi,SPEED_FEATURES *sf,int speed)

{
  FRAME_UPDATE_TYPE FVar1;
  int in_EDX;
  long in_RSI;
  long *in_RDI;
  bool bVar2;
  int leaf_and_overlay_frames;
  FRAME_UPDATE_TYPE update_type;
  int is_720p_or_larger;
  int short_dimension;
  AV1_COMMON *cm;
  int local_38;
  int local_34;
  
  if ((0 < in_EDX) && (in_EDX < 4)) {
    if ((int)in_RDI[0x77f7] < *(int *)((long)in_RDI + 0x3bfbc)) {
      local_34 = (int)in_RDI[0x77f7];
    }
    else {
      local_34 = *(int *)((long)in_RDI + 0x3bfbc);
    }
    if ((int)in_RDI[0x77f7] < *(int *)((long)in_RDI + 0x3bfbc)) {
      local_38 = (int)in_RDI[0x77f7];
    }
    else {
      local_38 = *(int *)((long)in_RDI + 0x3bfbc);
    }
    FVar1 = get_frame_update_type((GF_GROUP *)(*in_RDI + 400),(uint)*(byte *)(in_RDI + 0xe258));
    bVar2 = true;
    if ((FVar1 != '\x01') && (bVar2 = true, FVar1 != '\x04')) {
      bVar2 = FVar1 == '\x05';
    }
    if ((local_34 < 0x1e1) || (0x2cf < local_34)) {
      if ((0x2cf < local_38) && ((in_EDX < 3 && (bVar2)))) {
        *(undefined4 *)(in_RSI + 0x3b8) = 0x80;
        *(undefined4 *)(in_RSI + 0x3bc) = 0x80;
      }
    }
    else {
      *(undefined4 *)(in_RSI + 0x3b8) = 0x80;
      *(undefined4 *)(in_RSI + 0x3bc) = 0x80;
    }
  }
  return;
}

Assistant:

static void set_speed_features_lc_dec_qindex_dependent(
    const AV1_COMP *const cpi, SPEED_FEATURES *const sf, int speed) {
  if (speed < 1 || speed > 3) return;

  const AV1_COMMON *const cm = &cpi->common;
  const int short_dimension = AOMMIN(cm->width, cm->height);
  const int is_720p_or_larger = AOMMIN(cm->width, cm->height) >= 720;
  const FRAME_UPDATE_TYPE update_type =
      get_frame_update_type(&cpi->ppi->gf_group, cpi->gf_frame_index);
  const int leaf_and_overlay_frames =
      (update_type == LF_UPDATE || update_type == OVERLAY_UPDATE ||
       update_type == INTNL_OVERLAY_UPDATE);

  if (short_dimension > 480 && short_dimension < 720) {
    sf->lpf_sf.min_lr_unit_size = RESTORATION_UNITSIZE_MAX >> 1;
    sf->lpf_sf.max_lr_unit_size = RESTORATION_UNITSIZE_MAX >> 1;
  } else if (is_720p_or_larger && speed <= 2 && leaf_and_overlay_frames) {
    sf->lpf_sf.min_lr_unit_size = RESTORATION_UNITSIZE_MAX >> 1;
    sf->lpf_sf.max_lr_unit_size = RESTORATION_UNITSIZE_MAX >> 1;
  }
}